

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaultShaders.cpp
# Opt level: O3

string * __thiscall
vera::getDefaultSrc_abi_cxx11_(string *__return_storage_ptr__,vera *this,DefaultShaders _type)

{
  long *plVar1;
  string *psVar2;
  long *plVar3;
  string *psVar4;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,versionLine_abi_cxx11_,
             DAT_00431908 + versionLine_abi_cxx11_);
  switch((ulong)this & 0xffffffff) {
  case 0:
    psVar2 = &default_vert_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &default_vert_abi_cxx11_;
    }
    break;
  case 1:
    psVar2 = &default_frag_abi_cxx11_;
    break;
  case 2:
    psVar2 = &default_texture_frag_abi_cxx11_;
    break;
  case 3:
    psVar2 = &default_scene_vert_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &default_scene_vert_abi_cxx11_;
    }
    break;
  case 4:
    std::operator+(&local_50,&default_scene_frag0_abi_cxx11_,&default_scene_frag1_abi_cxx11_);
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_50,
                                (ulong)default_scene_frag2_abi_cxx11_._M_dataplus._M_p);
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_80 = *plVar3;
      lStack_78 = plVar1[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar3;
      local_90 = (long *)*plVar1;
    }
    local_88 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,
                                (ulong)default_scene_frag3_abi_cxx11_._M_dataplus._M_p);
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_60 = *plVar3;
      lStack_58 = plVar1[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar3;
      local_70 = (long *)*plVar1;
    }
    local_68 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_50._M_dataplus._M_p);
    return __return_storage_ptr__;
  case 5:
    psVar2 = &billboard_vert_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &billboard_vert_abi_cxx11_;
    }
    break;
  case 6:
    psVar2 = &dynamic_billboard_vert_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &dynamic_billboard_vert_abi_cxx11_;
    }
    break;
  case 7:
    psVar2 = &dynamic_billboard_frag_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &dynamic_billboard_frag_abi_cxx11_;
    }
    break;
  case 8:
    psVar4 = &cube_vert_abi_cxx11_;
    psVar2 = &cube_vert_300_abi_cxx11_;
    goto LAB_002441e5;
  case 9:
    psVar4 = &cube_frag_abi_cxx11_;
    psVar2 = &cube_frag_300_abi_cxx11_;
LAB_002441e5:
    if (versionNumber < 0x82) {
      psVar2 = psVar4;
    }
    break;
  case 10:
    psVar2 = &error_vert_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &error_vert_abi_cxx11_;
    }
    break;
  case 0xb:
    psVar2 = &error_frag_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &error_frag_abi_cxx11_;
    }
    break;
  case 0xc:
    psVar2 = &light_vert_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &light_vert_abi_cxx11_;
    }
    break;
  case 0xd:
    psVar2 = &light_frag_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &light_frag_abi_cxx11_;
    }
    break;
  case 0xe:
    psVar2 = &fill_vert_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &fill_vert_abi_cxx11_;
    }
    break;
  case 0xf:
    psVar2 = &fill_frag_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &fill_frag_abi_cxx11_;
    }
    break;
  case 0x10:
    psVar2 = &points_vert_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &points_vert_abi_cxx11_;
    }
    break;
  case 0x11:
    psVar2 = &points_frag_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &points_frag_abi_cxx11_;
    }
    break;
  case 0x12:
    psVar2 = &default_buffer_position_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &default_buffer_position_abi_cxx11_;
    }
    break;
  case 0x13:
    psVar2 = &default_buffer_normal_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &default_buffer_normal_abi_cxx11_;
    }
    break;
  case 0x14:
    psVar2 = &plot_frag_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &plot_frag_abi_cxx11_;
    }
    break;
  case 0x15:
    psVar2 = &fxaa_frag_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &fxaa_frag_abi_cxx11_;
    }
    break;
  case 0x16:
    psVar2 = &poissonfill_frag_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &poissonfill_frag_abi_cxx11_;
    }
    break;
  case 0x17:
    psVar2 = &jumpflood_frag_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &jumpflood_frag_abi_cxx11_;
    }
    break;
  case 0x18:
    psVar2 = &devlook_billboard_vert_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &devlook_billboard_vert_abi_cxx11_;
    }
    break;
  case 0x19:
    psVar2 = &devlook_sphere_vert_300_abi_cxx11_;
    if (versionNumber < 0x82) {
      psVar2 = &devlook_sphere_vert_abi_cxx11_;
    }
    break;
  default:
    goto switchD_00243ddd_default;
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(psVar2->_M_dataplus)._M_p);
switchD_00243ddd_default:
  return __return_storage_ptr__;
}

Assistant:

std::string getDefaultSrc( DefaultShaders _type ) {
    std::string rta = versionLine;

    if (_type == VERT_DEFAULT) {
        if (versionNumber < 130)
            rta += default_vert;
        else if (versionNumber >= 130) 
            rta += default_vert_300;
    }
    else if (_type == FRAG_DEFAULT) {
        rta += default_frag;
    }
    else if (_type == FRAG_DEFAULT_TEXTURE) {
        rta += default_texture_frag;
    }
    else if (_type == VERT_DEFAULT_SCENE) {
        if (versionNumber < 130)
            rta += default_scene_vert;
        else if (versionNumber >= 130) 
            rta += default_scene_vert_300;
    }
    else if (_type == FRAG_DEFAULT_SCENE) {
        rta += default_scene_frag0 + default_scene_frag1 + default_scene_frag2 + default_scene_frag3;
    }
    else if (_type == VERT_BILLBOARD) {
        if (versionNumber < 130)
            rta += billboard_vert;
        else if (versionNumber >= 130) 
            rta += billboard_vert_300;
    }
    else if (_type == VERT_DYNAMIC_BILLBOARD) {
        if (versionNumber < 130)
            rta += dynamic_billboard_vert;
        else if (versionNumber >= 130) 
            rta += dynamic_billboard_vert_300;
    }
    else if (_type == FRAG_DYNAMIC_BILLBOARD) {
        if (versionNumber < 130)
            rta += dynamic_billboard_frag;
        else if (versionNumber >= 130) 
            rta += dynamic_billboard_frag_300;
    }
    else if (_type == VERT_CUBEMAP) {
        if (versionNumber < 130)
            rta += cube_vert;
        else if (versionNumber >= 130) 
            rta += cube_vert_300;
    }
    else if (_type == FRAG_CUBEMAP) {
        if (versionNumber < 130)
            rta += cube_frag;
        else if (versionNumber >= 130) 
            rta += cube_frag_300;
    }
    else if (_type == VERT_ERROR) {
        if (versionNumber < 130)
            rta += error_vert;
        else if (versionNumber >= 130) 
            rta += error_vert_300;
    }
    else if (_type == FRAG_ERROR) {
        if (versionNumber < 130)
            rta += error_frag;
        else if (versionNumber >= 130) 
            rta += error_frag_300;
    }
    else if (_type == VERT_LIGHT) {
        if (versionNumber < 130)
            rta += light_vert;
        else if (versionNumber >= 130) 
            rta += light_vert_300;
    }
    else if (_type == FRAG_LIGHT) {
        if (versionNumber < 130)
            rta += light_frag;
        else if (versionNumber >= 130) 
            rta += light_frag_300;
    }

    else if (_type == VERT_FILL) {
        if (versionNumber < 130)
            rta += fill_vert;
        else if (versionNumber >= 130) 
            rta += fill_vert_300;
    }
    else if (_type == FRAG_FILL) {
        if (versionNumber < 130)
            rta += fill_frag;
        else if (versionNumber >= 130) 
            rta += fill_frag_300;
    }

    else if (_type == VERT_POINTS) {
        if (versionNumber < 130)
            rta += points_vert;
        else if (versionNumber >= 130) 
            rta += points_vert_300;
    }
    else if (_type == FRAG_POINTS) {
        if (versionNumber < 130)
            rta += points_frag;
        else if (versionNumber >= 130) 
            rta += points_frag_300;
    }

    else if (_type == FRAG_POSITION) {
        if (versionNumber < 130)
            rta += default_buffer_position;
        else if (versionNumber >= 130) 
            rta += default_buffer_position_300;
    }
    else if (_type == FRAG_NORMAL) {
        if (versionNumber < 130)
            rta += default_buffer_normal;
        else if (versionNumber >= 130) 
            rta += default_buffer_normal_300;
    }

    else if (_type == FRAG_PLOT) {
        if (versionNumber < 130)
            rta += plot_frag;
        else if (versionNumber >= 130) 
            rta += plot_frag_300;
    }
    else if (_type == FRAG_FXAA) {
        if (versionNumber < 130)
            rta += fxaa_frag;
        else if (versionNumber >= 130) 
            rta += fxaa_frag_300;
    }
    else if (_type == FRAG_POISSONFILL) {
        if (versionNumber < 130)
            rta += poissonfill_frag;
        else if (versionNumber >= 130) 
            rta += poissonfill_frag_300;
    } 
    else if (_type == FRAG_JUMPFLOOD) {
        if (versionNumber < 130)
            rta += jumpflood_frag;
        else if (versionNumber >= 130) 
            rta += jumpflood_frag_300;
    }
    else if (_type == VERT_DEVLOOK_BILLBOARD) {
        if (versionNumber < 130)
            rta += devlook_billboard_vert;
        else if (versionNumber >= 130) 
            rta += devlook_billboard_vert_300;
    }
    else if (_type == VERT_DEVLOOK_SPHERE) {
        if (versionNumber < 130)
            rta += devlook_sphere_vert;
        else if (versionNumber >= 130) 
            rta += devlook_sphere_vert_300;
    }

    return rta;
}